

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block.cc
# Opt level: O0

void __thiscall leveldb::Block::Block(Block *this,BlockContents *contents)

{
  uint32_t uVar1;
  char *pcVar2;
  size_t sVar3;
  size_t max_restarts_allowed;
  BlockContents *contents_local;
  Block *this_local;
  
  pcVar2 = Slice::data(&contents->data);
  this->data_ = pcVar2;
  sVar3 = Slice::size(&contents->data);
  this->size_ = sVar3;
  this->owned_ = (bool)(contents->heap_allocated & 1);
  if (this->size_ < 4) {
    this->size_ = 0;
  }
  else {
    sVar3 = this->size_;
    uVar1 = NumRestarts(this);
    if (sVar3 - 4 >> 2 < (ulong)uVar1) {
      this->size_ = 0;
    }
    else {
      sVar3 = this->size_;
      uVar1 = NumRestarts(this);
      this->restart_offset_ = (int)sVar3 + (uVar1 + 1) * -4;
    }
  }
  return;
}

Assistant:

Block::Block(const BlockContents& contents)
    : data_(contents.data.data()),
      size_(contents.data.size()),
      owned_(contents.heap_allocated) {
  if (size_ < sizeof(uint32_t)) {
    size_ = 0;  // Error marker
  } else {
    size_t max_restarts_allowed = (size_ - sizeof(uint32_t)) / sizeof(uint32_t);
    if (NumRestarts() > max_restarts_allowed) {
      // The size is too small for NumRestarts()
      size_ = 0;
    } else {
      restart_offset_ = size_ - (1 + NumRestarts()) * sizeof(uint32_t);
    }
  }
}